

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmCommonTargetGenerator::HaveRequiredLanguages
          (cmCommonTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languagesNeeded)

{
  pointer ppcVar1;
  cmMakefile *this_00;
  bool bVar2;
  cmState *this_01;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  pointer ppcVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_98;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  string local_50;
  
  ppcVar5 = (sources->
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  ppcVar1 = (sources->
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar1) {
    do {
      cmSourceFile::GetLanguage_abi_cxx11_(&local_98,*ppcVar5);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)languagesNeeded,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar1);
  }
  this_00 = this->Makefile;
  this_01 = cmMakefile::GetState(this_00);
  p_Var4 = &(languagesNeeded->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (languagesNeeded->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var4;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = cmState::GetLanguageEnabled(this_01,(string *)(p_Var3 + 1));
    if (!bVar2) {
      local_98._M_dataplus._M_p = (pointer)0xd;
      local_98._M_string_length = 0x96cef8;
      local_98.field_2._M_allocated_capacity = 0;
      local_78 = *(undefined8 *)(p_Var3 + 1);
      local_98.field_2._8_8_ = p_Var3[1]._M_parent;
      local_70 = 0;
      local_68 = 0xa8;
      local_60 = 
      " was requested for compilation but was not enabled. To enable a language it needs to be specified in a \'project\' or \'enable_language\' command in the root CMakeLists.txt"
      ;
      local_58 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_98;
      cmCatViews(&local_50,views);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) break;
    }
  }
  return (_Rb_tree_header *)p_Var3 == p_Var4;
}

Assistant:

bool cmCommonTargetGenerator::HaveRequiredLanguages(
  const std::vector<cmSourceFile const*>& sources,
  std::set<std::string>& languagesNeeded) const
{
  for (cmSourceFile const* sf : sources) {
    languagesNeeded.insert(sf->GetLanguage());
  }

  auto* makefile = this->Makefile;
  auto* state = makefile->GetState();
  auto unary = [&state, &makefile](const std::string& lang) -> bool {
    const bool valid = state->GetLanguageEnabled(lang);
    if (!valid) {
      makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The language ", lang,
                 " was requested for compilation but was not enabled."
                 " To enable a language it needs to be specified in a"
                 " 'project' or 'enable_language' command in the root"
                 " CMakeLists.txt"));
    }
    return valid;
  };
  return std::all_of(languagesNeeded.cbegin(), languagesNeeded.cend(), unary);
}